

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::UnaryExpression::getEffectiveWidthImpl(UnaryExpression *this)

{
  UnaryExpression *in_RDI;
  Expression *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  _Optional_payload_base<unsigned_int> local_8;
  
  if (in_RDI->op < BitwiseAnd) {
    operand(in_RDI);
    local_8 = (_Optional_payload_base<unsigned_int>)
              Expression::getEffectiveWidth(in_stack_ffffffffffffffd8);
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x842164);
    Type::getBitWidth((Type *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)in_RDI,&in_stack_ffffffffffffffd8->kind);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> UnaryExpression::getEffectiveWidthImpl() const {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::Minus:
        case UnaryOperator::BitwiseNot:
            return operand().getEffectiveWidth();
        default:
            return type->getBitWidth();
    }
}